

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EventLoopThreadPool.cpp
# Opt level: O0

void __thiscall
EventLoopThreadPool::EventLoopThreadPool
          (EventLoopThreadPool *this,EventLoop *baseLoop,int numThreads)

{
  LogStream *this_00;
  undefined4 in_EDX;
  undefined8 in_RSI;
  undefined8 *in_RDI;
  char *in_stack_ffffffffffffefd8;
  Logger *in_stack_ffffffffffffefe0;
  Logger *in_stack_fffffffffffff020;
  
  *in_RDI = in_RSI;
  *(undefined1 *)(in_RDI + 1) = 0;
  *(undefined4 *)((long)in_RDI + 0xc) = in_EDX;
  *(undefined4 *)(in_RDI + 2) = 0;
  std::vector<std::shared_ptr<EventLoopThread>,_std::allocator<std::shared_ptr<EventLoopThread>_>_>
  ::vector((vector<std::shared_ptr<EventLoopThread>,_std::allocator<std::shared_ptr<EventLoopThread>_>_>
            *)0x10cf99);
  std::vector<EventLoop_*,_std::allocator<EventLoop_*>_>::vector
            ((vector<EventLoop_*,_std::allocator<EventLoop_*>_> *)0x10cfac);
  if (*(int *)((long)in_RDI + 0xc) < 1) {
    Logger::Logger(in_stack_ffffffffffffefe0,in_stack_ffffffffffffefd8,0);
    this_00 = Logger::stream((Logger *)&stack0xfffffffffffff010);
    LogStream::operator<<(this_00,in_stack_ffffffffffffefd8);
    Logger::~Logger(in_stack_fffffffffffff020);
    abort();
  }
  return;
}

Assistant:

EventLoopThreadPool::EventLoopThreadPool(EventLoop* baseLoop, int numThreads)
        :baseLoop_(baseLoop), started_(false), numThreads_(numThreads), next_(0) {
            if(numThreads_ <= 0){
                LOG<<"numThreads<=0";
                abort();
            }
}